

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O3

void __thiscall JsUtil::FBVEnumerator::MoveToNextBit(FBVEnumerator *this)

{
  BVUnit *pBVar1;
  long lVar2;
  byte bVar3;
  BVUnit *pBVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (this->curUnit).word;
  if (uVar6 == 0) {
    uVar5 = this->curOffset & 0xffffffc0;
    this->curOffset = uVar5;
    pBVar4 = this->icur;
    pBVar1 = this->iend;
    do {
      uVar5 = uVar5 + 0x40;
      pBVar4 = pBVar4 + 1;
      if (pBVar4 == pBVar1) {
        this->icur = pBVar4;
        return;
      }
      uVar6 = pBVar4->word;
      (this->curUnit).word = uVar6;
      this->curOffset = uVar5;
    } while (uVar6 == 0);
    this->icur = pBVar4;
  }
  lVar2 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
    }
  }
  this->curOffset = this->curOffset & 0xffffffc0 | (uint)lVar2;
  BVUnitT<unsigned_long>::AssertRange((uint)lVar2);
  bVar3 = (byte)lVar2 & 0x3f;
  (this->curUnit).word = (this->curUnit).word & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3)
  ;
  return;
}

Assistant:

void
    FBVEnumerator::MoveToNextBit()
    {
        if(curUnit.IsEmpty())
        {
            this->curOffset = BVUnit::Floor(curOffset);
            this->MoveToValidWord();
            if(this->End())
            {
                return;
            }
        }

        BVIndex i = curUnit.GetNextBit();
        AssertMsg(BVInvalidIndex != i, "Fatal Exception. Error in Bitvector implementation");

        curOffset = BVUnit::Floor(curOffset) + i ;
        curUnit.Clear(i);
    }